

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::read
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  StackTrace *this_00;
  pointer prVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  size_t in_R8;
  lock_guard<ipc::spinlock> local_f8;
  lock_guard<ipc::spinlock> lg;
  iterator local_c0;
  size_t local_80;
  undefined1 local_78 [8];
  iterator it;
  lock_guard<ipc::spinlock> exLockT;
  VarState *var;
  ThreadState *thr;
  size_t size_local;
  void *addr_local;
  void *pc_local;
  tls_t tls_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  this_00 = ThreadState::get_stackDepot((ThreadState *)CONCAT44(in_register_00000034,__fd));
  StackTrace::set_read_write(this_00,__nbytes,(size_t)__buf);
  std::lock_guard<ipc::spinlock>::lock_guard
            ((lock_guard<ipc::spinlock> *)&it.it_end_.field_1,&this->vars_spl);
  local_80 = __nbytes;
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  ::find<unsigned_long>
            ((iterator *)local_78,
             (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
              *)&this->vars,&local_80);
  phmap::container_internal::
  parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
  ::end(&local_c0,
        (parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
         *)&this->vars);
  bVar1 = phmap::container_internal::operator==((iterator *)local_78,&local_c0);
  if (bVar1) {
    create_var((iterator *)&lg,this,__nbytes,in_R8);
    memcpy(local_78,&lg,0x30);
  }
  prVar2 = phmap::container_internal::
           parallel_hash_set<4UL,_phmap::container_internal::raw_hash_set,_phmap::NullMutex,_phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
           ::iterator::operator->((iterator *)local_78);
  std::lock_guard<ipc::spinlock>::~lock_guard((lock_guard<ipc::spinlock> *)&it.it_end_.field_1);
  std::lock_guard<ipc::spinlock>::lock_guard(&local_f8,&(prVar2->second).lock);
  read(this,__fd,&prVar2->second,__nbytes);
  std::lock_guard<ipc::spinlock>::~lock_guard(&local_f8);
  return extraout_RAX;
}

Assistant:

void read(tls_t tls, void* pc, void* addr, size_t size) final {
    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);
    thr->get_stackDepot().set_read_write((size_t)(addr),
                                         reinterpret_cast<size_t>(pc));
    VarState* var;
    {
      std::lock_guard<ipc::spinlock> exLockT(vars_spl);
      auto it = vars.find((size_t)(addr));
      if (it == vars.end()) {  // create new variable if new
#if MAKE_OUTPUT
        std::cout << "variable is read before written" << std::endl;  // warning
#endif
        it = create_var((size_t)(addr), size);
      }
      var = &(it->second);
    }
    std::lock_guard<ipc::spinlock> lg(var->lock);
    read(thr, var, (size_t)addr);
  }